

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O1

int Test_SUNMatScaleAddI2(SUNMatrix A,N_Vector x,N_Vector y)

{
  uint uVar1;
  int iVar2;
  SUNMatrix B;
  N_Vector y_00;
  N_Vector z;
  SUNMatrix B_00;
  SUNMatrix p_Var3;
  char *pcVar4;
  
  B = SUNMatClone(A);
  y_00 = N_VClone(x);
  z = N_VClone(x);
  uVar1 = SUNMatCopy(A,B);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAddI(-1.0,B);
    if (uVar1 != 0) {
      pcVar4 = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
      goto LAB_00103978;
    }
    uVar1 = SUNMatMatvec(B,x,y_00);
    if (uVar1 != 0) {
      pcVar4 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
      goto LAB_00103978;
    }
    N_VLinearSum(1.0,x,-1.0,y,z);
    iVar2 = check_vector(y_00,z,2.220446049250313e-14);
    if (iVar2 == 0) {
      puts("    PASSED test -- SUNMatScaleAddI2 check 1 ");
      B_00 = SUNMatClone(A);
      SUNSparseMatrix_Reallocate(B_00,*A->content + *(long *)((long)A->content + 0x10));
      uVar1 = SUNMatCopy(A,B_00);
      p_Var3 = B_00;
      if (uVar1 == 0) {
        uVar1 = SUNMatScaleAddI(-1.0,B_00);
        if (uVar1 == 0) {
          uVar1 = SUNMatMatvec(B_00,x,y_00);
          if (uVar1 == 0) {
            N_VLinearSum(1.0,x,-1.0,y,z);
            iVar2 = check_vector(y_00,z,2.220446049250313e-14);
            if (iVar2 == 0) {
              puts("    PASSED test -- SUNMatScaleAddI2 check 2 ");
              p_Var3 = SUNMatClone(B_00);
              uVar1 = SUNMatCopy(B_00,p_Var3);
              if (uVar1 == 0) {
                uVar1 = SUNMatScaleAddI(-1.0,p_Var3);
                if (uVar1 == 0) {
                  uVar1 = SUNMatMatvec(p_Var3,x,y_00);
                  if (uVar1 == 0) {
                    iVar2 = check_vector(y_00,y,2.220446049250313e-14);
                    if (iVar2 == 0) {
                      puts("    PASSED test -- SUNMatScaleAddI2 check 3 ");
                      SUNMatDestroy(B);
                      SUNMatDestroy(B_00);
                      iVar2 = 0;
                      goto LAB_00103986;
                    }
                    puts(">>> FAILED test -- SUNMatScaleAddI2 check 3 ");
                    puts("\nA =");
                    SUNSparseMatrix_Print(A,_stdout);
                    puts("\nD =");
                    SUNSparseMatrix_Print(p_Var3,_stdout);
                    puts("\nz =");
                    N_VPrint_Serial(y_00);
                    puts("\ny =");
                    N_VPrint_Serial(y);
                    SUNMatDestroy(B);
                    B = B_00;
                    goto LAB_00103ba0;
                  }
                  pcVar4 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
                }
                else {
                  pcVar4 = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
                }
              }
              else {
                pcVar4 = ">>> FAILED test -- SUNMatCopy returned %d \n";
              }
              printf(pcVar4,(ulong)uVar1);
              SUNMatDestroy(B);
              SUNMatDestroy(B_00);
              iVar2 = 1;
            }
            else {
              puts(">>> FAILED test -- SUNMatScaleAddI2 check 2 ");
              puts("\nA =");
              SUNSparseMatrix_Print(A,_stdout);
              puts("\nC =");
              SUNSparseMatrix_Print(B_00,_stdout);
              puts("\nz =");
              N_VPrint_Serial(y_00);
              puts("\nw =");
              N_VPrint_Serial(z);
LAB_00103ba0:
              SUNMatDestroy(B);
              iVar2 = 1;
            }
            goto LAB_00103986;
          }
          pcVar4 = ">>> FAILED test -- SUNMatMatvec returned %d \n";
        }
        else {
          pcVar4 = ">>> FAILED test -- SUNMatScaleAddI returned %d \n";
        }
      }
      else {
        pcVar4 = ">>> FAILED test -- SUNMatCopy returned %d \n";
      }
      printf(pcVar4,(ulong)uVar1);
      SUNMatDestroy(B);
      iVar2 = 1;
      goto LAB_00103986;
    }
    puts(">>> FAILED test -- SUNMatScaleAddI2 check 1 ");
    puts("\nA =");
    SUNSparseMatrix_Print(A,_stdout);
    puts("\nB =");
    SUNSparseMatrix_Print(B,_stdout);
    puts("\nz =");
    N_VPrint_Serial(y_00);
    puts("\nw =");
    N_VPrint_Serial(z);
  }
  else {
    pcVar4 = ">>> FAILED test -- SUNMatCopy returned %d \n";
LAB_00103978:
    printf(pcVar4,(ulong)uVar1);
  }
  iVar2 = 1;
  p_Var3 = B;
LAB_00103986:
  SUNMatDestroy(p_Var3);
  N_VDestroy(y_00);
  N_VDestroy(z);
  return iVar2;
}

Assistant:

int Test_SUNMatScaleAddI2(SUNMatrix A, N_Vector x, N_Vector y)
{
  int       failure;
  SUNMatrix B, C, D;
  N_Vector  w, z;
  realtype  tol=100*UNIT_ROUNDOFF;

  /* create clones for test */
  B = SUNMatClone(A);
  z = N_VClone(x);
  w = N_VClone(x);

  /* test 1: add I to a matrix with insufficient storage */
  failure = SUNMatCopy(A, B);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",
           failure);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, B);   /* B = I-A */
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",
           failure);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatMatvec(B, x, z);
  if (failure) {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n",
           failure);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  N_VLinearSum(ONE,x,NEG_ONE,y,w);
  failure = check_vector(z, w, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 1 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A,stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B,stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  else {
    printf("    PASSED test -- SUNMatScaleAddI2 check 1 \n");
  }

  /* test 2: add I to a matrix with sufficient but misplaced
     storage */
  C = SUNMatClone(A);
  failure = SUNSparseMatrix_Reallocate(C, SM_NNZ_S(A)+SM_ROWS_S(A));
  failure = SUNMatCopy(A, C);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, C);   /* C = I-A */
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatMatvec(C, x, z);
  if (failure) {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  N_VLinearSum(ONE,x,NEG_ONE,y,w);
  failure = check_vector(z, w, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 2 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A,stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C,stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  else {
    printf("    PASSED test -- SUNMatScaleAddI2 check 2 \n");
  }


  /* test 3: add I to a matrix with appropriate structure already in place */
  D = SUNMatClone(C);
  failure = SUNMatCopy(C, D);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, D);   /* D = A */
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatMatvec(D, x, z);
  if (failure) {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = check_vector(z, y, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 3 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A,stdout);
    printf("\nD =\n");
    SUNSparseMatrix_Print(D,stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  else {
    printf("    PASSED test -- SUNMatScaleAddI2 check 3 \n");
  }

  SUNMatDestroy(B);
  SUNMatDestroy(C);
  SUNMatDestroy(D);
  N_VDestroy(z);
  N_VDestroy(w);
  return(0);
}